

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_vertex3f(float x,float y,float z)

{
  rf_vertex_buffer *prVar1;
  rf_draw_call *prVar2;
  rf_source_location source_location;
  long lVar3;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  rf_vec3 rVar4;
  undefined4 uStack_6c;
  undefined8 local_50;
  float local_48;
  undefined8 local_20;
  rf_vec3 vec;
  float z_local;
  float y_local;
  float x_local;
  
  local_20 = CONCAT44(y,x);
  vec.x = z;
  if (((rf__ctx->field_0).transform_matrix_required & 1U) != 0) {
    rVar4.z = z;
    rVar4.x = x;
    rVar4.y = y;
    rVar4 = rf_vec3_transform(rVar4,(rf__ctx->field_0).transform);
    local_50 = rVar4._0_8_;
    local_48 = rVar4.z;
    local_20 = local_50;
    vec.x = local_48;
  }
  if (((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].v_counter <
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].elements_count * 4) {
    ((rf__ctx->field_0).current_batch)->vertex_buffers
    [((rf__ctx->field_0).current_batch)->current_buffer].vertices
    [((rf__ctx->field_0).current_batch)->vertex_buffers
     [((rf__ctx->field_0).current_batch)->current_buffer].v_counter * 3] =
         (rf_gfx_vertex_data_type)local_20;
    ((rf__ctx->field_0).current_batch)->vertex_buffers
    [((rf__ctx->field_0).current_batch)->current_buffer].vertices
    [((rf__ctx->field_0).current_batch)->vertex_buffers
     [((rf__ctx->field_0).current_batch)->current_buffer].v_counter * 3 + 1] = local_20._4_4_;
    ((rf__ctx->field_0).current_batch)->vertex_buffers
    [((rf__ctx->field_0).current_batch)->current_buffer].vertices
    [((rf__ctx->field_0).current_batch)->vertex_buffers
     [((rf__ctx->field_0).current_batch)->current_buffer].v_counter * 3 + 2] = vec.x;
    prVar1 = ((rf__ctx->field_0).current_batch)->vertex_buffers;
    lVar3 = ((rf__ctx->field_0).current_batch)->current_buffer;
    prVar1[lVar3].v_counter = prVar1[lVar3].v_counter + 1;
    prVar2 = ((rf__ctx->field_0).current_batch)->draw_calls;
    lVar3 = ((rf__ctx->field_0).current_batch)->draw_calls_counter + -1;
    prVar2[lVar3].vertex_count = prVar2[lVar3].vertex_count + 1;
  }
  else {
    source_location.proc_name = "rf_gfx_vertex3f";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x9ba5;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Render batch elements limit reached. Max bacht elements: %d",6,
                (ulong)(uint)(((rf__ctx->field_0).current_batch)->vertex_buffers
                              [((rf__ctx->field_0).current_batch)->current_buffer].elements_count <<
                             2),"rf_gfx_vertex3f",in_R9);
    lVar3 = *in_FS_OFFSET;
    *(char **)(lVar3 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar3 + -0x458) = "rf_gfx_vertex3f";
    *(undefined8 *)(lVar3 + -0x450) = 0x9ba5;
    *(ulong *)(lVar3 + -0x448) = CONCAT44(uStack_6c,6);
  }
  return;
}

Assistant:

RF_API void rf_gfx_vertex3f(float x, float y, float z)
{
    rf_vec3 vec = {x, y, z };

    // rf_transform provided vector if required
    if (rf_ctx.transform_matrix_required) vec = rf_vec3_transform(vec, rf_ctx.transform);

    // Verify that rf_max_batch_elements limit not reached
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter < (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4))
    {
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter] = vec.x;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 1] = vec.y;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 2] = vec.z;
        rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter++;

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count++;
    }
    else RF_LOG_ERROR(RF_LIMIT_REACHED, "Render batch elements limit reached. Max bacht elements: %d", rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4);
}